

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_highbd_hadamard_16x16_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *in_RDX;
  tran_low_t b3;
  tran_low_t b2;
  tran_low_t b1;
  tran_low_t b0;
  tran_low_t a3;
  tran_low_t a2;
  tran_low_t a1;
  tran_low_t a0;
  int16_t *src_ptr;
  int idx;
  tran_low_t *in_stack_00000150;
  ptrdiff_t in_stack_00000158;
  int16_t *in_stack_00000160;
  int local_1c;
  int *local_18;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    aom_highbd_hadamard_8x8_c(in_stack_00000160,in_stack_00000158,in_stack_00000150);
  }
  local_18 = in_RDX;
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    iVar1 = *local_18 + local_18[0x40] >> 1;
    iVar2 = *local_18 - local_18[0x40] >> 1;
    iVar3 = local_18[0x80] + local_18[0xc0] >> 1;
    iVar4 = local_18[0x80] - local_18[0xc0] >> 1;
    *local_18 = iVar1 + iVar3;
    local_18[0x40] = iVar2 + iVar4;
    local_18[0x80] = iVar1 - iVar3;
    local_18[0xc0] = iVar2 - iVar4;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void aom_highbd_hadamard_16x16_c(const int16_t *src_diff, ptrdiff_t src_stride,
                                 tran_low_t *coeff) {
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 13 bit, dynamic range [-4095, 4095]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_highbd_hadamard_8x8_c(src_ptr, src_stride, coeff + idx * 64);
  }

  // coeff: 19 bit, dynamic range [-262080, 262080]
  for (idx = 0; idx < 64; ++idx) {
    tran_low_t a0 = coeff[0];
    tran_low_t a1 = coeff[64];
    tran_low_t a2 = coeff[128];
    tran_low_t a3 = coeff[192];

    tran_low_t b0 = (a0 + a1) >> 1;
    tran_low_t b1 = (a0 - a1) >> 1;
    tran_low_t b2 = (a2 + a3) >> 1;
    tran_low_t b3 = (a2 - a3) >> 1;

    // new coeff dynamic range: 20 bit
    coeff[0] = b0 + b2;
    coeff[64] = b1 + b3;
    coeff[128] = b0 - b2;
    coeff[192] = b1 - b3;

    ++coeff;
  }
}